

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.cpp
# Opt level: O1

attribute * __thiscall MinVR::element::get_attribute(element *this,char *the_name)

{
  element *peVar1;
  _List_node_base *p_Var2;
  int iVar3;
  char *__s1;
  
  peVar1 = (element *)
           (this->m_attribute_list).
           super__List_base<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_>._M_impl._M_node
           .super__List_node_base._M_next;
  (this->it)._M_node = (_List_node_base *)peVar1;
  while( true ) {
    if (peVar1 == this) {
      return (attribute *)0x0;
    }
    __s1 = attribute::get_name(*(attribute **)
                                &((list<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_> *)
                                 ((long)peVar1 + 0x10))->
                                 super__List_base<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_>
                              );
    iVar3 = strcmp(__s1,the_name);
    p_Var2 = (this->it)._M_node;
    if (iVar3 == 0) break;
    peVar1 = (element *)p_Var2->_M_next;
    (this->it)._M_node = (_List_node_base *)peVar1;
  }
  return (attribute *)p_Var2[1]._M_next;
}

Assistant:

attribute* element::get_attribute(const char* the_name)
{
    it = m_attribute_list.begin();
    while(it != m_attribute_list.end())
    {
        if(strcmp((*it)->get_name(), the_name) == 0)
        {
            return ((attribute*) *it);
            break;
        }
        it++;
    }
    return NULL;
}